

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O2

void __thiscall
cfd::core::TaprootScriptTree::AddBranch(TaprootScriptTree *this,TaprootScriptTree *tree)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  TapBranch::AddBranch(&this->super_TapBranch,&tree->super_TapBranch);
  TapBranch::GetCurrentBranchHash((ByteData256 *)&local_30,&tree->super_TapBranch);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
  emplace_back<cfd::core::ByteData256>(&this->nodes_,(ByteData256 *)&local_30);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  return;
}

Assistant:

void TaprootScriptTree::AddBranch(const TaprootScriptTree& tree) {
  TapBranch::AddBranch(tree);
  nodes_.emplace_back(tree.GetCurrentBranchHash());
}